

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

JavascriptString *
Js::JavascriptString::Concat3
          (JavascriptString *pstLeft,JavascriptString *pstCenter,JavascriptString *pstRight)

{
  ConcatStringMulti *this;
  
  this = ConcatStringMulti::New
                   (3,pstLeft,pstCenter,
                    (((((pstLeft->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                    super_JavascriptLibraryBase).scriptContext.ptr);
  ConcatStringMulti::SetItem(this,2,pstRight);
  return (JavascriptString *)this;
}

Assistant:

JavascriptString *
    JavascriptString::Concat3(JavascriptString * pstLeft, JavascriptString * pstCenter, JavascriptString * pstRight)
    {
        ConcatStringMulti * concatString = ConcatStringMulti::New(3, pstLeft, pstCenter, pstLeft->GetScriptContext());
        concatString->SetItem(2, pstRight);
        return concatString;
    }